

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)1,google::protobuf::internal::BoundedZCIS>
          (MessageLite *this,BoundedZCIS *input)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  MessageLite *in_RCX;
  BoundedZCIS input_00;
  
  (*this->_vptr_MessageLite[7])();
  input_00.zcis = (ZeroCopyInputStream *)(ulong)(uint)input->limit;
  input_00._8_8_ = this;
  bVar1 = internal::MergePartialFromImpl<false>((internal *)input->zcis,input_00,in_RCX);
  if (bVar1) {
    iVar3 = (*this->_vptr_MessageLite[8])(this);
    cVar2 = (char)iVar3;
    if (cVar2 == '\0') {
      LogInitializationErrorMessage(this);
    }
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}